

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::FCDUTF8CollationIterator::handleNextCE32
          (FCDUTF8CollationIterator *this,UChar32 *c,UErrorCode *errorCode)

{
  int iVar1;
  byte bVar2;
  UBool UVar3;
  byte bVar4;
  char16_t cVar5;
  UChar32 UVar6;
  uint32_t uVar7;
  int32_t iVar8;
  uint32_t ce32;
  uint8_t t2;
  uint8_t t1;
  UErrorCode *errorCode_local;
  UChar32 *c_local;
  FCDUTF8CollationIterator *this_local;
  
  while( true ) {
    while (this->state == CHECK_FWD) {
      if ((this->super_UTF8CollationIterator).pos == (this->super_UTF8CollationIterator).length) {
        *c = -1;
        return 0xc0;
      }
      iVar1 = (this->super_UTF8CollationIterator).pos;
      (this->super_UTF8CollationIterator).pos = iVar1 + 1;
      *c = (uint)(this->super_UTF8CollationIterator).u8[iVar1];
      if ((*c & 0x80U) == 0) {
        return ((this->super_UTF8CollationIterator).super_CollationIterator.trie)->data32[*c];
      }
      if ((((*c < 0xe0) || (0xef < *c)) ||
          (((this->super_UTF8CollationIterator).length <=
            (this->super_UTF8CollationIterator).pos + 1 &&
           (-1 < (this->super_UTF8CollationIterator).length)))) ||
         ((bVar4 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos],
          ((int)" 000000000000\x1000"[(int)(*c & 0xf)] & 1 << (sbyte)((int)(uint)bVar4 >> 5)) == 0
          || (bVar2 = (this->super_UTF8CollationIterator).u8
                      [(this->super_UTF8CollationIterator).pos + 1] + 0x80, 0x3f < bVar2)))) {
        if ((*c < 0xe0) &&
           (((0xc1 < *c &&
             ((this->super_UTF8CollationIterator).pos != (this->super_UTF8CollationIterator).length)
             ) && (bVar4 = (this->super_UTF8CollationIterator).u8
                           [(this->super_UTF8CollationIterator).pos] + 0x80, bVar4 < 0x40)))) {
          uVar7 = ((this->super_UTF8CollationIterator).super_CollationIterator.trie)->data32
                  [(int)((uint)((this->super_UTF8CollationIterator).super_CollationIterator.trie)->
                               index[*c + 0x760] + (uint)bVar4)];
          *c = (*c & 0x1fU) << 6 | (uint)bVar4;
          (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos + 1;
          UVar3 = CollationFCD::hasTccc(*c);
          if (UVar3 == '\0') {
            return uVar7;
          }
          if ((this->super_UTF8CollationIterator).pos == (this->super_UTF8CollationIterator).length)
          {
            return uVar7;
          }
          UVar3 = nextHasLccc(this);
          if (UVar3 == '\0') {
            return uVar7;
          }
          (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos + -2;
        }
        else {
          UVar6 = utf8_nextCharSafeBody_63
                            ((this->super_UTF8CollationIterator).u8,
                             &(this->super_UTF8CollationIterator).pos,
                             (this->super_UTF8CollationIterator).length,*c,-3);
          *c = UVar6;
          if (*c == 0xfffd) {
            return 0xfffd0505;
          }
          UVar3 = CollationFCD::hasTccc((*c >> 10) + 0xd7c0U & 0xffff);
          if (((UVar3 == '\0') ||
              ((this->super_UTF8CollationIterator).pos == (this->super_UTF8CollationIterator).length
              )) || (UVar3 = nextHasLccc(this), UVar3 == '\0')) {
            uVar7 = CollationData::getCE32FromSupplementary
                              ((this->super_UTF8CollationIterator).super_CollationIterator.data,*c);
            return uVar7;
          }
          (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos + -4;
        }
      }
      else {
        *c = (*c & 0xfU) << 0xc | (bVar4 & 0x3f) << 6 | (uint)bVar2;
        (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos + 2;
        UVar3 = CollationFCD::hasTccc(*c);
        if ((UVar3 == '\0') ||
           ((UVar3 = CollationFCD::maybeTibetanCompositeVowel(*c), UVar3 == '\0' &&
            (((this->super_UTF8CollationIterator).pos == (this->super_UTF8CollationIterator).length
             || (UVar3 = nextHasLccc(this), UVar3 == '\0')))))) goto LAB_0028bc2c;
        (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos + -3;
      }
      UVar3 = nextSegment(this,errorCode);
      if (UVar3 == '\0') {
        *c = -1;
        return 0xc0;
      }
    }
    if ((this->state == IN_FCD_SEGMENT) && ((this->super_UTF8CollationIterator).pos != this->limit))
    {
      uVar7 = UTF8CollationIterator::handleNextCE32(&this->super_UTF8CollationIterator,c,errorCode);
      return uVar7;
    }
    if ((this->state == IN_NORMALIZED) &&
       (iVar1 = (this->super_UTF8CollationIterator).pos,
       iVar8 = UnicodeString::length(&this->normalized), iVar1 != iVar8)) break;
    switchToForward(this);
  }
  iVar1 = (this->super_UTF8CollationIterator).pos;
  (this->super_UTF8CollationIterator).pos = iVar1 + 1;
  cVar5 = UnicodeString::operator[](&this->normalized,iVar1);
  *c = (uint)(ushort)cVar5;
LAB_0028bc2c:
  return ((this->super_UTF8CollationIterator).super_CollationIterator.trie)->data32
         [(int)((uint)((this->super_UTF8CollationIterator).super_CollationIterator.trie)->index
                      [*c >> 5] * 4 + (*c & 0x1fU))];
}

Assistant:

uint32_t
FCDUTF8CollationIterator::handleNextCE32(UChar32 &c, UErrorCode &errorCode) {
    for(;;) {
        if(state == CHECK_FWD) {
            // Combination of UTF8CollationIterator::handleNextCE32() with FCD check fastpath.
            if(pos == length) {
                c = U_SENTINEL;
                return Collation::FALLBACK_CE32;
            }
            c = u8[pos++];
            if(U8_IS_SINGLE(c)) {
                // ASCII 00..7F
                return trie->data32[c];
            }
            uint8_t t1, t2;
            if(0xe0 <= c && c < 0xf0 &&
                    ((pos + 1) < length || length < 0) &&
                    U8_IS_VALID_LEAD3_AND_T1(c, t1 = u8[pos]) &&
                    (t2 = (u8[pos + 1] - 0x80)) <= 0x3f) {
                // U+0800..U+FFFF except surrogates
                c = (((c & 0xf) << 12) | ((t1 & 0x3f) << 6) | t2);
                pos += 2;
                if(CollationFCD::hasTccc(c) &&
                        (CollationFCD::maybeTibetanCompositeVowel(c) ||
                            (pos != length && nextHasLccc()))) {
                    pos -= 3;
                } else {
                    break;  // return CE32(BMP)
                }
            } else if(c < 0xe0 && c >= 0xc2 && pos != length && (t1 = (u8[pos] - 0x80)) <= 0x3f) {
                // U+0080..U+07FF
                uint32_t ce32 = trie->data32[trie->index[(UTRIE2_UTF8_2B_INDEX_2_OFFSET - 0xc0) + c] + t1];
                c = ((c & 0x1f) << 6) | t1;
                ++pos;
                if(CollationFCD::hasTccc(c) && pos != length && nextHasLccc()) {
                    pos -= 2;
                } else {
                    return ce32;
                }
            } else {
                // Function call for supplementary code points and error cases.
                // Illegal byte sequences yield U+FFFD.
                c = utf8_nextCharSafeBody(u8, &pos, length, c, -3);
                if(c == 0xfffd) {
                    return Collation::FFFD_CE32;
                } else {
                    U_ASSERT(c > 0xffff);
                    if(CollationFCD::hasTccc(U16_LEAD(c)) && pos != length && nextHasLccc()) {
                        pos -= 4;
                    } else {
                        return data->getCE32FromSupplementary(c);
                    }
                }
            }
            if(!nextSegment(errorCode)) {
                c = U_SENTINEL;
                return Collation::FALLBACK_CE32;
            }
            continue;
        } else if(state == IN_FCD_SEGMENT && pos != limit) {
            return UTF8CollationIterator::handleNextCE32(c, errorCode);
        } else if(state == IN_NORMALIZED && pos != normalized.length()) {
            c = normalized[pos++];
            break;
        } else {
            switchToForward();
        }
    }
    return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
}